

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTrig>::SetNodeIndex
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTrig> *this,int i,int64_t nodeindex)

{
  long *plVar1;
  
  if (5 < (uint)i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZGeoElRefLess::SetNodeIndex index error i = ",0x2e);
    plVar1 = (long *)std::ostream::operator<<(&std::cout,i);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    return;
  }
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[(uint)i] = nodeindex;
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::SetNodeIndex(int i,int64_t nodeindex){
	if(i<0 || i>(TGeo::NNodes - 1)){
		std::cout << "TPZGeoElRefLess::SetNodeIndex index error i = " << i << std::endl;
		return;
	}
	fGeo.fNodeIndexes[i] = nodeindex;
}